

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O3

Result __thiscall wabt::TypeChecker::OnBrTableTarget(TypeChecker *this,Index depth)

{
  _Alloc_hider _Var1;
  Result RVar2;
  int *prefix;
  _anonymous_namespace_ *this_00;
  int *piVar3;
  bool bVar4;
  _anonymous_namespace_ *this_01;
  bool bVar5;
  string local_70;
  string local_50;
  Label *local_30;
  Label *label;
  
  RVar2 = GetLabel(this,depth,&local_30);
  bVar4 = true;
  bVar5 = bVar4;
  if (RVar2.enum_ != Error) {
    this_01 = (_anonymous_namespace_ *)&local_30->result_types;
    if (local_30->label_type == Loop) {
      this_01 = (_anonymous_namespace_ *)&local_30->param_types;
    }
    RVar2 = CheckSignature(this,(TypeVector *)this_01,"br_table");
    bVar5 = RVar2.enum_ == Error;
    this_00 = (_anonymous_namespace_ *)this->br_table_sig_;
    if ((_anonymous_namespace_ *)this->br_table_sig_ == (_anonymous_namespace_ *)0x0) {
      this->br_table_sig_ = (TypeVector *)this_01;
      this_00 = this_01;
    }
    prefix = *(int **)this_00;
    piVar3 = *(int **)this_01;
    if ((long)*(int **)(this_00 + 8) - (long)prefix == *(long *)(this_01 + 8) - (long)piVar3) {
      for (; prefix != *(int **)(this_00 + 8); prefix = prefix + 1) {
        if (*prefix != *piVar3) goto LAB_00f52b01;
        piVar3 = piVar3 + 1;
      }
    }
    else {
LAB_00f52b01:
      (anonymous_namespace)::TypesToString_abi_cxx11_
                (&local_70,this_00,(TypeVector *)0x0,(char *)prefix);
      _Var1._M_p = local_70._M_dataplus._M_p;
      (anonymous_namespace)::TypesToString_abi_cxx11_
                (&local_50,this_01,(TypeVector *)0x0,(char *)prefix);
      PrintError(this,"br_table labels have inconsistent types: expected %s, got %s",_Var1._M_p,
                 local_50._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      bVar5 = bVar4;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
    }
  }
  RVar2.enum_._1_3_ = 0;
  RVar2.enum_._0_1_ = bVar5;
  return (Result)RVar2.enum_;
}

Assistant:

Result TypeChecker::OnBrTableTarget(Index depth) {
  Result result = Result::Ok;
  Label* label;
  CHECK_RESULT(GetLabel(depth, &label));
  TypeVector& label_sig = label->br_types();
  result |= CheckSignature(label_sig, "br_table");

  // Make sure this label's signature is consistent with the previous labels'
  // signatures.
  if (br_table_sig_ == nullptr) {
    br_table_sig_ = &label_sig;
  }
  if (*br_table_sig_ != label_sig) {
    result |= Result::Error;
    PrintError("br_table labels have inconsistent types: expected %s, got %s",
               TypesToString(*br_table_sig_).c_str(),
               TypesToString(label_sig).c_str());
  }

  return result;
}